

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::MergeUpdateLoop<int>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  void *__dest_00;
  uint uVar1;
  uint uVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  row_t rVar8;
  void *__dest_01;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  data_ptr_t pdVar14;
  ulong uVar15;
  ulong uVar16;
  size_t __n;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  sel_t result_ids [2048];
  int result_values [2048];
  uint local_4038 [2048];
  undefined4 local_2038 [2050];
  
  pSVar3 = update->sel;
  pdVar4 = update->data;
  lVar12 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  uVar1 = base_info->max;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)uVar1 * 4);
  __dest_01 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  lVar13 = (ulong)update_info->max * 4;
  if (count == 0) {
    lVar21 = 0;
    uVar20 = 0;
  }
  else {
    pdVar5 = base_data->data;
    psVar6 = sel->sel_vector;
    uVar17 = (ulong)update_info->N;
    uVar18 = (ulong)base_info->N;
    uVar20 = 0;
    uVar16 = 0;
    lVar21 = 0;
    uVar11 = 0;
    do {
      uVar9 = uVar16;
      if (psVar6 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar6[uVar16];
      }
      uVar10 = ids[uVar9] - lVar12;
      bVar22 = uVar20 < uVar17;
      uVar9 = uVar11;
      if (bVar22) {
        uVar15 = (ulong)*(uint *)((long)&update_info[1].segment + uVar20 * 4);
        if (uVar15 < uVar10) {
          lVar19 = 0;
          do {
            local_2038[lVar21 + lVar19] =
                 *(undefined4 *)((long)&update_info[1].segment + lVar19 * 4 + uVar20 * 4 + lVar13);
            local_4038[lVar21 + lVar19] = (uint)uVar15;
            if ((1 - uVar17) + uVar20 + lVar19 == 0) {
              lVar21 = lVar21 + lVar19 + 1;
              uVar20 = uVar20 + 1 + lVar19;
              goto LAB_017c369d;
            }
            uVar15 = (ulong)*(uint *)((long)&update_info[1].segment + lVar19 * 4 + uVar20 * 4 + 4);
            lVar19 = lVar19 + 1;
          } while (uVar15 < uVar10);
          uVar20 = uVar20 + lVar19;
          bVar22 = uVar20 < uVar17;
          lVar21 = lVar21 + lVar19;
        }
        if ((!bVar22) || (uVar10 != uVar15)) goto LAB_017c369d;
        local_2038[lVar21] = *(undefined4 *)((long)__dest_01 + uVar20 * 4);
        local_4038[lVar21] = (uint)uVar15;
        uVar20 = uVar20 + 1;
      }
      else {
LAB_017c369d:
        bVar22 = uVar11 < uVar18;
        if (bVar22) {
          uVar15 = (ulong)*(uint *)((long)&__dest->segment + uVar11 * 4);
          if (uVar15 < uVar10) {
            do {
              uVar9 = uVar18;
              if (uVar18 - 1 == uVar11) goto LAB_017c36dd;
              uVar15 = (ulong)*(uint *)((long)&base_info[1].segment + uVar11 * 4 + 4);
              uVar11 = uVar11 + 1;
            } while (uVar15 < uVar10);
            bVar22 = uVar11 < uVar18;
          }
          uVar9 = uVar11;
          if ((!bVar22) || (uVar10 != uVar15)) goto LAB_017c36dd;
          pdVar14 = (data_ptr_t)((long)__dest_00 + uVar11 * 4);
        }
        else {
LAB_017c36dd:
          pdVar14 = pdVar5 + uVar10 * 4;
        }
        local_2038[lVar21] = *(undefined4 *)pdVar14;
        local_4038[lVar21] = (uint)uVar10;
      }
      lVar21 = lVar21 + 1;
      uVar16 = uVar16 + 1;
      uVar11 = uVar9;
    } while (uVar16 != count);
  }
  uVar11 = (ulong)update_info->N;
  if (uVar20 <= uVar11 && uVar11 - uVar20 != 0) {
    __n = (uVar11 - uVar20) * 4;
    switchD_012dd528::default
              (local_2038 + lVar21,(void *)((long)&update_info[1].segment + lVar13 + uVar20 * 4),__n
              );
    switchD_012dd528::default
              (local_4038 + lVar21,(void *)((long)&update_info[1].segment + uVar20 * 4),__n);
    lVar21 = (lVar21 - uVar20) + uVar11;
  }
  update_info->N = (sel_t)lVar21;
  switchD_012dd528::default(__dest_01,local_2038,lVar21 << 2);
  switchD_012dd528::default(update_info + 1,local_4038,lVar21 << 2);
  uVar20 = (ulong)base_info->N;
  if (count == 0 || uVar20 == 0) {
    lVar13 = 0;
    uVar17 = 0;
    uVar11 = 0;
  }
  else {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar3->sel_vector;
    lVar13 = 0;
    uVar11 = 0;
    uVar17 = 0;
    do {
      uVar16 = uVar11;
      if (psVar6 != (sel_t *)0x0) {
        uVar16 = (ulong)psVar6[uVar11];
      }
      uVar18 = ids[uVar16] - lVar12;
      uVar2 = *(uint *)((long)&__dest->segment + uVar17 * 4);
      if (uVar18 == uVar2) {
        if (psVar7 != (sel_t *)0x0) {
          uVar16 = (ulong)psVar7[uVar16];
        }
        local_2038[lVar13] = *(undefined4 *)(pdVar4 + uVar16 * 4);
        local_4038[lVar13] = (uint)uVar18;
        uVar11 = uVar11 + 1;
LAB_017c385d:
        uVar17 = uVar17 + 1;
      }
      else {
        if (uVar2 <= uVar18) {
          local_2038[lVar13] = *(undefined4 *)((long)__dest_00 + uVar17 * 4);
          local_4038[lVar13] = uVar2;
          goto LAB_017c385d;
        }
        if (psVar7 != (sel_t *)0x0) {
          uVar16 = (ulong)psVar7[uVar16];
        }
        local_2038[lVar13] = *(undefined4 *)(pdVar4 + uVar16 * 4);
        local_4038[lVar13] = (uint)uVar18;
        uVar11 = uVar11 + 1;
      }
      lVar13 = lVar13 + 1;
    } while ((uVar11 < count) && (uVar17 < uVar20));
  }
  if (uVar11 < count) {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar3->sel_vector;
    do {
      uVar16 = uVar11;
      if (psVar6 != (sel_t *)0x0) {
        uVar16 = (ulong)psVar6[uVar11];
      }
      uVar18 = uVar16;
      if (psVar7 != (sel_t *)0x0) {
        uVar18 = (ulong)psVar7[uVar16];
      }
      rVar8 = ids[uVar16];
      local_2038[lVar13] = *(undefined4 *)(pdVar4 + uVar18 * 4);
      local_4038[lVar13] = (int)rVar8 - (int)lVar12;
      lVar13 = lVar13 + 1;
      uVar11 = uVar11 + 1;
    } while (count != uVar11);
  }
  lVar12 = uVar20 - uVar17;
  if (uVar17 <= uVar20 && lVar12 != 0) {
    switchD_012dd528::default
              (local_2038 + lVar13,
               (void *)((long)&base_info[1].segment + (ulong)uVar1 * 4 + uVar17 * 4),lVar12 * 4);
    switchD_012dd528::default
              (local_4038 + lVar13,(void *)((long)&base_info[1].segment + uVar17 * 4),lVar12 * 4);
    lVar13 = lVar13 + lVar12;
  }
  base_info->N = (sel_t)lVar13;
  switchD_012dd528::default(__dest_00,local_2038,lVar13 << 2);
  switchD_012dd528::default(__dest,local_4038,lVar13 << 2);
  return;
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}